

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

void __thiscall
Js::FunctionBody::RecordCrossFrameEntryExitRecord
          (FunctionBody *this,uint byteCodeOffset,bool isEnterBlock)

{
  Type *addr;
  Type *pTVar1;
  int iVar2;
  Recycler *this_00;
  CrossFrameEntryExitRecord *pCVar3;
  code *pcVar4;
  bool bVar5;
  Recycler *alloc;
  List<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar6;
  AuxStatementData *pAVar7;
  undefined4 *puVar8;
  undefined1 local_60 [8];
  CrossFrameEntryExitRecord record;
  
  EnsureAuxStatementData(this);
  pAVar7 = (this->m_sourceInfo).m_auxStatementData.ptr;
  this_00 = ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext)->recycler;
  if ((pAVar7 == (AuxStatementData *)0x0) ||
     ((pAVar7->m_crossFrameBlockEntryExisRecords).ptr ==
      (List<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0)) {
    local_60 = (undefined1  [8])
               &JsUtil::
                List<Js::FunctionBody::CrossFrameEntryExitRecord,Memory::Recycler,true,Js::CopyRemovePolicy,DefaultComparer>
                ::typeinfo;
    record.m_byteCodeOffset = 0;
    record.m_isEnterBlock = false;
    record._5_3_ = 0;
    alloc = Memory::Recycler::TrackAllocInfo(this_00,(TrackAllocData *)local_60);
    pLVar6 = (List<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
              *)new<Memory::Recycler>(0x30,alloc,0x387914);
    (pLVar6->
    super_ReadOnlyList<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_DefaultComparer>
    ).alloc = this_00;
    (pLVar6->
    super_ReadOnlyList<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_DefaultComparer>
    )._vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014db218;
    (pLVar6->
    super_ReadOnlyList<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_DefaultComparer>
    ).buffer.ptr = (CrossFrameEntryExitRecord *)0x0;
    (pLVar6->
    super_ReadOnlyList<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_DefaultComparer>
    ).count = 0;
    pLVar6->length = 0;
    pLVar6->increment = 4;
    pAVar7 = (this->m_sourceInfo).m_auxStatementData.ptr;
    addr = &pAVar7->m_crossFrameBlockEntryExisRecords;
    Memory::Recycler::WBSetBit((char *)addr);
    (pAVar7->m_crossFrameBlockEntryExisRecords).ptr = pLVar6;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    pAVar7 = (this->m_sourceInfo).m_auxStatementData.ptr;
    if (pAVar7 != (AuxStatementData *)0x0) goto LAB_007713d7;
  }
  else {
LAB_007713d7:
    if ((pAVar7->m_crossFrameBlockEntryExisRecords).ptr !=
        (List<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
         *)0x0) goto LAB_00771430;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar8 = 1;
  bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                              ,0x1f6a,"(this->GetCrossFrameEntryExitRecords())",
                              "this->GetCrossFrameEntryExitRecords()");
  if (!bVar5) {
    pcVar4 = (code *)invalidInstructionException();
    (*pcVar4)();
  }
  *puVar8 = 0;
LAB_00771430:
  CrossFrameEntryExitRecord::CrossFrameEntryExitRecord
            ((CrossFrameEntryExitRecord *)local_60,byteCodeOffset,isEnterBlock);
  pAVar7 = (this->m_sourceInfo).m_auxStatementData.ptr;
  if (pAVar7 == (AuxStatementData *)0x0) {
    pLVar6 = (List<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
              *)0x0;
  }
  else {
    pLVar6 = (pAVar7->m_crossFrameBlockEntryExisRecords).ptr;
  }
  JsUtil::
  List<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_true,_Js::CopyRemovePolicy,_DefaultComparer>
  ::EnsureArray(pLVar6,0);
  pCVar3 = (pLVar6->
           super_ReadOnlyList<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_DefaultComparer>
           ).buffer.ptr;
  iVar2 = (pLVar6->
          super_ReadOnlyList<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_DefaultComparer>
          ).count;
  pCVar3[iVar2].m_isEnterBlock = local_60[4];
  pCVar3[iVar2].m_byteCodeOffset = local_60._0_4_;
  pTVar1 = &(pLVar6->
            super_ReadOnlyList<Js::FunctionBody::CrossFrameEntryExitRecord,_Memory::Recycler,_DefaultComparer>
            ).count;
  *pTVar1 = *pTVar1 + 1;
  return;
}

Assistant:

void FunctionBody::RecordCrossFrameEntryExitRecord(uint byteCodeOffset, bool isEnterBlock)
    {
        this->EnsureAuxStatementData();

        Recycler* recycler = this->m_scriptContext->GetRecycler();
        if (this->GetCrossFrameEntryExitRecords() == nullptr)
        {
            m_sourceInfo.m_auxStatementData->m_crossFrameBlockEntryExisRecords = RecyclerNew(recycler, CrossFrameEntryExitRecordList, recycler);
        }
        Assert(this->GetCrossFrameEntryExitRecords());

        CrossFrameEntryExitRecord record(byteCodeOffset, isEnterBlock);
        this->GetCrossFrameEntryExitRecords()->Add(record); // Will copy stack value and put the copy into the container.
    }